

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O0

bool GatherInversionSyms(ParseNode *stmt,Symbol *outerVar,ParseNode *innerLoop,
                        ByteCodeGenerator *byteCodeGenerator,SymCheck *symCheck)

{
  bool bVar1;
  ParseNodeBin *pPVar2;
  ParseNodeVar *pPVar3;
  ParseNodeName *pPVar4;
  ParseNodeName *pnodeNameLhs;
  Symbol *auxSym;
  ParseNode *lhs;
  SymCheck *symCheck_local;
  ByteCodeGenerator *byteCodeGenerator_local;
  ParseNode *innerLoop_local;
  Symbol *outerVar_local;
  ParseNode *stmt_local;
  
  if (stmt != (ParseNode *)0x0) {
    auxSym = (Symbol *)0x0;
    pnodeNameLhs = (ParseNodeName *)0x0;
    if (stmt->nop == knopAsg) {
      pPVar2 = ParseNode::AsParseNodeBin(stmt);
      auxSym = (Symbol *)pPVar2->pnode1;
    }
    else if (stmt->nop == knopVarDecl) {
      pPVar3 = ParseNode::AsParseNodeVar(stmt);
      pnodeNameLhs = (ParseNodeName *)pPVar3->sym;
    }
    if (auxSym != (Symbol *)0x0) {
      if (*(char *)&(auxSym->name).string.ptr == '0') {
        return false;
      }
      if (*(char *)&(auxSym->name).string.ptr == '\x01') {
        pPVar4 = ParseNode::AsParseNodeName((ParseNode *)auxSym);
        if ((pPVar4->sym == (Symbol *)0x0) || (bVar1 = Symbol::GetIsGlobal(pPVar4->sym), bVar1)) {
          return false;
        }
        pnodeNameLhs = (ParseNodeName *)pPVar4->sym;
      }
    }
    if (pnodeNameLhs != (ParseNodeName *)0x0) {
      bVar1 = SymCheck::AddSymbol(symCheck,(Symbol *)pnodeNameLhs);
      return bVar1;
    }
  }
  return true;
}

Assistant:

bool GatherInversionSyms(ParseNode* stmt, Symbol* outerVar, ParseNode* innerLoop, ByteCodeGenerator* byteCodeGenerator, SymCheck* symCheck)
{
    if (stmt != nullptr)
    {
        ParseNode* lhs = nullptr;
        Symbol* auxSym = nullptr;

        if (stmt->nop == knopAsg)
        {
            lhs = stmt->AsParseNodeBin()->pnode1;
        }
        else if (stmt->nop == knopVarDecl)
        {
            auxSym = stmt->AsParseNodeVar()->sym;
        }

        if (lhs != nullptr)
        {
            if (lhs->nop == knopDot)
            {
                return false;
            }

            if (lhs->nop == knopName)
            {
                ParseNodeName * pnodeNameLhs = lhs->AsParseNodeName();
                if ((pnodeNameLhs->sym == nullptr) || (pnodeNameLhs->sym->GetIsGlobal()))
                {
                    return false;
                }
                else
                {
                    auxSym = pnodeNameLhs->sym;
                }
            }
        }

        if (auxSym != nullptr)
        {
            return symCheck->AddSymbol(auxSym);
        }
    }

    return true;
}